

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O2

void lsp::LanguageService::toClient_notification_telemetry_event(json *params)

{
  element_type *this;
  undefined1 auStack_f8 [16];
  Parameter local_e8;
  Notification notification;
  
  jsonrpcpp::Parameter::Parameter((Parameter *)(auStack_f8 + 0x10),params);
  jsonrpcpp::Notification::Notification
            (&notification,"telemetry/event",(Parameter *)(auStack_f8 + 0x10));
  jsonrpcpp::Parameter::~Parameter((Parameter *)(auStack_f8 + 0x10));
  this = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  jsonrpcpp::Notification::to_json_abi_cxx11_((Notification *)auStack_f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)(auStack_f8 + 0x10),
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)auStack_f8,-1,' ',false,strict);
  IOHandler::addMessageToSend(this,(string *)(auStack_f8 + 0x10));
  std::__cxx11::string::~string((string *)(auStack_f8 + 0x10));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)auStack_f8);
  jsonrpcpp::Notification::~Notification(&notification);
  return;
}

Assistant:

void lsp::LanguageService::toClient_notification_telemetry_event(const json &params)
{
    jsonrpcpp::Notification notification("telemetry/event", params);
    ioHandler_->addMessageToSend(notification.to_json().dump());
}